

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int VmProcessLongOpt(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  sxi32 sVar1;
  char *zName;
  long lVar2;
  ushort **ppuVar3;
  char *pB1;
  char *pcVar4;
  char *pcVar5;
  sxu32 nSize;
  int local_38;
  int nByte;
  char *pcVar6;
  
  if ((pValue->iFlags & 1) != 0) {
    zName = jx9_value_to_string(pValue,&nByte);
    lVar2 = (long)nByte;
    if (0 < lVar2) {
      pcVar6 = zName + lVar2;
      pcVar5 = pcVar6;
      if (zName[lVar2 + -1] == ':') {
        do {
          pcVar6 = pcVar5;
          pcVar5 = pcVar6 + -1;
          if (pcVar5 < zName) break;
        } while (*pcVar5 == ':');
        if (pcVar6 + -1 <= zName) {
          return 0;
        }
        *pcVar6 = '\0';
        local_38 = 1;
      }
      else {
        local_38 = 0;
      }
      nSize = (int)pcVar6 - (int)zName;
      pcVar5 = *pUserData;
      pcVar6 = *(char **)((long)pUserData + 8);
      do {
        while( true ) {
          if (pcVar6 <= pcVar5) {
            return 0;
          }
          if (((*pcVar5 == '-') && (pcVar5 + 1 < pcVar6)) && (pcVar5[1] == '-')) break;
          pcVar5 = pcVar5 + 1;
        }
        pB1 = pcVar5 + 2;
        for (pcVar4 = pB1; pcVar5 = pcVar6, pcVar4 < pcVar6; pcVar4 = pcVar4 + 1) {
          ppuVar3 = __ctype_b_loc();
          pcVar5 = pcVar4;
          if (((long)*pcVar4 == 0x3d) || (((*ppuVar3)[*pcVar4] & 0x2000) != 0)) break;
        }
      } while (((int)pcVar5 - (int)pB1 != nSize) || (sVar1 = SyMemcmp(pB1,zName,nSize), sVar1 != 0))
      ;
      if (pcVar5 != (char *)0x0) {
        VmExtractOptArgValue
                  (*(jx9_value **)((long)pUserData + 0x18),*(jx9_value **)((long)pUserData + 0x10),
                   pcVar5,pcVar6,local_38,*(jx9_context **)((long)pUserData + 0x20),zName);
      }
    }
  }
  return 0;
}

Assistant:

static int VmProcessLongOpt(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	struct getopt_long_opt *pOpt = (struct getopt_long_opt *)pUserData;
	const char *zArg, *zOpt, *zEnd;
	int need_value = 0;
	int nByte;
	/* Value must be of type string */
	if( !jx9_value_is_string(pValue) ){
		/* Simply ignore */
		return JX9_OK;
	}
	zOpt = jx9_value_to_string(pValue, &nByte);
	if( nByte < 1 ){
		/* Empty string, ignore */
		return JX9_OK;
	}
	zEnd = &zOpt[nByte - 1];
	if( zEnd[0] == ':' ){
		char *zTerm;
		/* Try to extract a value */
		need_value = 1;
		while( zEnd >= zOpt && zEnd[0] == ':' ){
			zEnd--;
		}
		if( zOpt >= zEnd ){
			/* Empty string, ignore */
			SXUNUSED(pKey);
			return JX9_OK;
		}
		zEnd++;
		zTerm = (char *)zEnd;
		zTerm[0] = 0;
	}else{
		zEnd = &zOpt[nByte];
	}
	/* Find the option */
	zArg = VmFindLongOpt(zOpt, (int)(zEnd-zOpt), pOpt->zArgIn, pOpt->zArgEnd);
	if( zArg == 0 ){
		/* No such option, return immediately */
		return JX9_OK;
	}
	/* Try to extract a value */
	VmExtractOptArgValue(pOpt->pArray, pOpt->pWorker, zArg, pOpt->zArgEnd, need_value, pOpt->pCtx, zOpt);
	return JX9_OK;
}